

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

void clockCMD(packet_t *recv)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference neighborDowned;
  ostream *poVar4;
  mapped_type *pmVar5;
  void *this;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link,_std::allocator<Link>_> *__range1;
  packet_t *recv_local;
  
  currentClock = currentClock + 1;
  floodRoutingTablePacket();
  __end1 = std::vector<Link,_std::allocator<Link>_>::begin(&links);
  link = (Link *)std::vector<Link,_std::allocator<Link>_>::end(&links);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                *)&link);
    if (!bVar2) {
      return;
    }
    neighborDowned =
         __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator*
                   (&__end1);
    if ((3 < currentClock - neighborDowned->recvClock) && (neighborDowned->status == 1)) {
      poVar4 = std::operator<<((ostream *)&std::cout,"----- link down with : ");
      poVar4 = std::operator<<(poVar4,(string *)neighborDowned);
      poVar4 = std::operator<<(poVar4," -----");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      neighborDowned->status = 0;
      updateTableForLinkFailure(&neighborDowned->neighbor);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
               ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
      bVar2 = std::operator!=(&pmVar5->nextHop,"-\t");
      if (!bVar2) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                 ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
        iVar1 = pmVar5->cost;
        iVar3 = std::numeric_limits<int>::max();
        if (iVar1 == iVar3) goto LAB_00106534;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,">> ");
      poVar4 = std::operator<<(poVar4,(string *)neighborDowned);
      poVar4 = std::operator<<(poVar4," is still connected via ");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
               ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
      poVar4 = std::operator<<(poVar4,(string *)&pmVar5->nextHop);
      poVar4 = std::operator<<(poVar4," with cost ");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
               ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
      this = (void *)std::ostream::operator<<(poVar4,pmVar5->cost);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
LAB_00106534:
    __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

void clockCMD(const packet_t &recv) {
	currentClock++;
	floodRoutingTablePacket();

	for (auto &link : links) {
		if (currentClock - link.recvClock > 3 && link.status == UP) {
			cout << "----- link down with : " << link.neighbor << " -----" << endl;
			link.status = DOWN;
			updateTableForLinkFailure(link.neighbor);
			if (routingMap[link.neighbor].nextHop != NONE || routingMap[link.neighbor].cost != INF) {
				cout << ">> " << link.neighbor << " is still connected via " << routingMap[link.neighbor].nextHop
				     << " with cost " << routingMap[link.neighbor].cost << endl;
			}
		}
	}
}